

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::CPrimitiveMode::Run<glcts::(anonymous_namespace)::test_api::ES3>
          (CPrimitiveMode *this,bool pointMode)

{
  pointer *ppVVar1;
  allocator<tcu::Vector<float,_4>_> *paVar2;
  pointer pVVar3;
  GLuint GVar4;
  value_type vVar5;
  size_type sVar6;
  size_type sVar7;
  reference pvVar8;
  pointer pVVar9;
  reference pvVar10;
  runtime_error *this_00;
  long lVar11;
  uint uVar12;
  uint uVar13;
  DILogger local_d68;
  DILogger local_be8;
  DILogger local_a68;
  DILogger local_8e8;
  DILogger local_768;
  allocator<tcu::Vector<float,_4>_> local_5e1;
  Vector<float,_4> local_5e0;
  undefined1 local_5d0 [8];
  CColorArray bufferTest5;
  Vector<float,_4> local_5b0;
  undefined1 local_5a0 [8];
  CColorArray bufferTest4;
  Vector<float,_4> local_580;
  undefined1 local_570 [8];
  CColorArray bufferTest3;
  Vector<float,_4> local_550;
  undefined1 local_540 [8];
  CColorArray bufferRef5;
  Vector<float,_4> local_520;
  undefined1 local_510 [8];
  CColorArray bufferRef4;
  Vector<float,_4> local_4f0;
  undefined1 local_4e0 [8];
  CColorArray bufferRef3;
  undefined1 local_348 [8];
  DIResult result;
  Vector<float,_4> local_1b8;
  undefined1 local_1a8 [8];
  CColorArray bufferTest;
  Vector<float,_4> local_188;
  undefined1 local_178 [8];
  CColorArray bufferRef2;
  Vector<float,_4> local_158;
  undefined1 local_148 [8];
  CColorArray bufferRef1;
  size_t i;
  undefined1 local_120 [8];
  CElementArray elements;
  DrawArraysIndirectCommand indirectArrays;
  DrawElementsIndirectCommand indirectElements;
  allocator<tcu::Vector<float,_4>_> local_d9;
  Vector<float,_4> local_d8;
  undefined1 local_c8 [8];
  CColorArray padding;
  CColorArray coords;
  allocator<char> local_61;
  string local_60;
  string local_40;
  byte local_19;
  CPrimitiveMode *pCStack_18;
  bool pointMode_local;
  CPrimitiveMode *this_local;
  
  local_19 = pointMode;
  pCStack_18 = this;
  glu::CallLogWrapper::glClear
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x4000);
  if ((local_19 & 1) == 0) {
    anon_unknown_0::shaders::vshSimple<glcts::(anonymous_namespace)::test_api::ES3>();
  }
  else {
    anon_unknown_0::shaders::vshSimple_point<glcts::(anonymous_namespace)::test_api::ES3>();
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::ES3>();
  GVar4 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,&local_40,&local_60,
                     (string *)
                     &coords.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,true);
  this->_program = GVar4;
  std::__cxx11::string::~string
            ((string *)
             &coords.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  std::__cxx11::string::~string((string *)&local_40);
  if (this->_program == 0) {
    this_local = (CPrimitiveMode *)&DAT_ffffffffffffffff;
  }
  else {
    glu::CallLogWrapper::glUseProgram
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->_program);
    ppVVar1 = &padding.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)ppVVar1);
    DrawIndirectBase::PrimitiveGen
              (&this->super_DrawIndirectBase,this->_primitiveType,this->_drawSizeX,this->_drawSizeY,
               (CColorArray *)ppVVar1);
    glu::CallLogWrapper::glGenVertexArrays
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->_vao);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_buffer);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,this->_buffer);
    tcu::Vector<float,_4>::Vector(&local_d8,0.0);
    std::allocator<tcu::Vector<float,_4>_>::allocator(&local_d9);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_c8,10
               ,&local_d8,&local_d9);
    std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_d9);
    sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       &padding.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_c8);
    glu::CallLogWrapper::glBufferData
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,sVar6 * 0x10 + sVar7 * 0x10,(void *)0x0,0x88e0);
    sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_c8);
    pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_c8,0);
    glu::CallLogWrapper::glBufferSubData
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,0,sVar6 << 4,pvVar8);
    sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_c8);
    ppVVar1 = &padding.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    sVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       ppVVar1);
    pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        ppVVar1,0);
    glu::CallLogWrapper::glBufferSubData
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,sVar6 << 4,sVar7 << 4,pvVar8);
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0);
    indirectArrays.first = 0;
    indirectArrays.reservedMustBeZero = 0;
    elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    indirectArrays.count = 0;
    indirectArrays.primCount = 0;
    sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       &padding.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    i._4_4_ = 0;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&i + 3));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_120,sVar6,
               (value_type_conflict4 *)((long)&i + 4),(allocator<unsigned_int> *)((long)&i + 3));
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&i + 3));
    bufferRef1.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    while( true ) {
      pVVar3 = bufferRef1.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      pVVar9 = (pointer)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_120)
      ;
      if (pVVar9 <= pVVar3) break;
      vVar5 = (value_type)
              bufferRef1.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_120,
                           (size_type)
                           bufferRef1.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      *pvVar10 = vVar5;
      bufferRef1.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)(bufferRef1.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1);
    }
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_bufferIndirect);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8f3f,this->_bufferIndirect);
    if (this->_drawFunc == DRAW_ARRAYS) {
      sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                        ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         &padding.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT44(1,(uint)(sVar6 >> 1) & 0x7fffffff);
      indirectArrays.count = 10;
      indirectArrays.primCount = 0;
      glu::CallLogWrapper::glBufferData
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8f3f,0x10,(void *)0x0,0x88e4);
      glu::CallLogWrapper::glBufferSubData
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8f3f,0,0x10,
                 &elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      glu::CallLogWrapper::glDrawArraysIndirect
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->_primitiveType,(void *)0x0);
    }
    else {
      if (this->_drawFunc != DRAW_ELEMENTS) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Unknown draw function!");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                        ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         &padding.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      indirectArrays.reservedMustBeZero = 1;
      indirectArrays.first = (uint)(sVar6 >> 1) & 0x7fffffff;
      glu::CallLogWrapper::glBufferData
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8f3f,0x14,(void *)0x0,0x88e4);
      glu::CallLogWrapper::glBufferSubData
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8f3f,0,0x14,&indirectArrays.first);
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->_ebo);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8893,this->_ebo);
      sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_120);
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_120,0);
      glu::CallLogWrapper::glBufferData
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8893,sVar6 << 2,pvVar10,0x88e4);
      glu::CallLogWrapper::glDrawElementsIndirect
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->_primitiveType,0x1405,(void *)0x0);
    }
    uVar12 = this->_sizeX;
    uVar13 = this->_sizeY;
    tcu::Vector<float,_4>::Vector(&local_158,0.0,0.0,0.0,0.0);
    paVar2 = (allocator<tcu::Vector<float,_4>_> *)
             ((long)&bufferRef2.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<tcu::Vector<float,_4>_>::allocator(paVar2);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_148,
               (ulong)(uVar12 * uVar13 >> 1),&local_158,paVar2);
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)
               ((long)&bufferRef2.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    uVar12 = this->_sizeX;
    uVar13 = this->_sizeY;
    tcu::Vector<float,_4>::Vector(&local_188,0.1,0.2,0.3,1.0);
    paVar2 = (allocator<tcu::Vector<float,_4>_> *)
             ((long)&bufferTest.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<tcu::Vector<float,_4>_>::allocator(paVar2);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_178,
               (ulong)(uVar12 * uVar13 >> 1),&local_188,paVar2);
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)
               ((long)&bufferTest.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    uVar12 = this->_sizeX;
    uVar13 = this->_sizeY;
    tcu::Vector<float,_4>::Vector(&local_1b8,0.0);
    paVar2 = (allocator<tcu::Vector<float,_4>_> *)((long)&result.status_ + 7);
    std::allocator<tcu::Vector<float,_4>_>::allocator(paVar2);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_1a8,
               (ulong)(uVar12 * uVar13),&local_1b8,paVar2);
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)((long)&result.status_ + 7));
    DIResult::DIResult((DIResult *)local_348);
    uVar12 = this->_sizeX;
    uVar13 = this->_sizeY;
    pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_1a8,0);
    DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
              (&this->super_DrawIndirectBase,0,uVar13 + 1 >> 1,uVar12,uVar13 >> 1,pvVar8);
    uVar12 = this->_sizeY >> 1;
    lVar11 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                       ((DrawIndirectBase *)this,
                        (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_1a8,this->_sizeX,uVar12,
                        (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_148,this->_sizeX,uVar12);
    DIResult::sub_result
              ((DILogger *)
               &bufferRef3.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(DIResult *)local_348,lVar11);
    DILogger::~DILogger((DILogger *)
                        &bufferRef3.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (this->_primitiveType - 0xc < 2) {
      uVar12 = this->_sizeX;
      uVar13 = this->_sizeY;
      tcu::Vector<float,_4>::Vector(&local_4f0,0.0,0.0,0.0,0.0);
      paVar2 = (allocator<tcu::Vector<float,_4>_> *)
               ((long)&bufferRef4.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<tcu::Vector<float,_4>_>::allocator(paVar2);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_4e0
                 ,(ulong)(uVar12 * uVar13 >> 4),&local_4f0,paVar2);
      std::allocator<tcu::Vector<float,_4>_>::~allocator
                ((allocator<tcu::Vector<float,_4>_> *)
                 ((long)&bufferRef4.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      uVar12 = this->_sizeX;
      uVar13 = this->_sizeY;
      tcu::Vector<float,_4>::Vector(&local_520,0.1,0.2,0.3,1.0);
      paVar2 = (allocator<tcu::Vector<float,_4>_> *)
               ((long)&bufferRef5.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<tcu::Vector<float,_4>_>::allocator(paVar2);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_510
                 ,(ulong)(uVar12 * uVar13 >> 3),&local_520,paVar2);
      std::allocator<tcu::Vector<float,_4>_>::~allocator
                ((allocator<tcu::Vector<float,_4>_> *)
                 ((long)&bufferRef5.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      uVar12 = this->_sizeX;
      uVar13 = this->_sizeY;
      tcu::Vector<float,_4>::Vector(&local_550,0.0,0.0,0.0,0.0);
      paVar2 = (allocator<tcu::Vector<float,_4>_> *)
               ((long)&bufferTest3.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<tcu::Vector<float,_4>_>::allocator(paVar2);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_540
                 ,(ulong)(uVar12 * uVar13 >> 2),&local_550,paVar2);
      std::allocator<tcu::Vector<float,_4>_>::~allocator
                ((allocator<tcu::Vector<float,_4>_> *)
                 ((long)&bufferTest3.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      uVar12 = this->_sizeX;
      uVar13 = this->_sizeY;
      tcu::Vector<float,_4>::Vector(&local_580,0.0);
      paVar2 = (allocator<tcu::Vector<float,_4>_> *)
               ((long)&bufferTest4.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<tcu::Vector<float,_4>_>::allocator(paVar2);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_570
                 ,(ulong)(uVar12 * uVar13 >> 4),&local_580,paVar2);
      std::allocator<tcu::Vector<float,_4>_>::~allocator
                ((allocator<tcu::Vector<float,_4>_> *)
                 ((long)&bufferTest4.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      uVar12 = this->_sizeX;
      uVar13 = this->_sizeY;
      tcu::Vector<float,_4>::Vector(&local_5b0,0.0);
      paVar2 = (allocator<tcu::Vector<float,_4>_> *)
               ((long)&bufferTest5.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<tcu::Vector<float,_4>_>::allocator(paVar2);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_5a0
                 ,(ulong)(uVar12 * uVar13 >> 3),&local_5b0,paVar2);
      std::allocator<tcu::Vector<float,_4>_>::~allocator
                ((allocator<tcu::Vector<float,_4>_> *)
                 ((long)&bufferTest5.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      uVar12 = this->_sizeX;
      uVar13 = this->_sizeY;
      tcu::Vector<float,_4>::Vector(&local_5e0,0.0);
      std::allocator<tcu::Vector<float,_4>_>::allocator(&local_5e1);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_5d0
                 ,(ulong)(uVar12 * uVar13 >> 2),&local_5e0,&local_5e1);
      std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_5e1);
      uVar12 = this->_sizeX;
      uVar13 = this->_sizeY;
      pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_570,0);
      DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
                (&this->super_DrawIndirectBase,0,uVar13 + 3 >> 2,uVar12 >> 2,uVar13 >> 2,pvVar8);
      uVar13 = this->_sizeX >> 2;
      uVar12 = this->_sizeY >> 2;
      lVar11 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                         ((DrawIndirectBase *)this,
                          (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_570,uVar13,uVar12,
                          (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_4e0,uVar13,uVar12);
      DIResult::sub_result(&local_768,(DIResult *)local_348,lVar11);
      DILogger::~DILogger(&local_768);
      uVar12 = this->_sizeX;
      uVar13 = this->_sizeY;
      pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_5a0,0);
      DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
                (&this->super_DrawIndirectBase,uVar12 + 3 >> 2,uVar13 + 3 >> 2,uVar12 >> 1,
                 uVar13 >> 2,pvVar8);
      uVar13 = this->_sizeX >> 1;
      uVar12 = this->_sizeY >> 2;
      lVar11 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                         ((DrawIndirectBase *)this,
                          (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_5a0,uVar13,uVar12,
                          (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_510,uVar13,uVar12);
      DIResult::sub_result(&local_8e8,(DIResult *)local_348,lVar11);
      DILogger::~DILogger(&local_8e8);
      uVar12 = this->_sizeX;
      uVar13 = this->_sizeY;
      pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_570,0);
      DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
                (&this->super_DrawIndirectBase,uVar12 * 3 + 3 >> 2,uVar13 + 3 >> 2,uVar12 >> 2,
                 uVar13 >> 2,pvVar8);
      uVar13 = this->_sizeX >> 2;
      uVar12 = this->_sizeY >> 2;
      lVar11 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                         ((DrawIndirectBase *)this,
                          (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_570,uVar13,uVar12,
                          (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_4e0,uVar13,uVar12);
      DIResult::sub_result(&local_a68,(DIResult *)local_348,lVar11);
      DILogger::~DILogger(&local_a68);
      uVar12 = this->_sizeX;
      uVar13 = this->_sizeY;
      pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_5d0,0);
      DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
                (&this->super_DrawIndirectBase,0,0,uVar12,uVar13 >> 2,pvVar8);
      uVar12 = this->_sizeY >> 2;
      lVar11 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                         ((DrawIndirectBase *)this,
                          (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_5d0,this->_sizeX,uVar12,
                          (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_540,this->_sizeX,uVar12);
      DIResult::sub_result(&local_be8,(DIResult *)local_348,lVar11);
      DILogger::~DILogger(&local_be8);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_5d0
                );
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_5a0
                );
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_570
                );
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_540
                );
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_510
                );
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_4e0
                );
    }
    else {
      uVar12 = this->_sizeX;
      uVar13 = this->_sizeY;
      pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_1a8,0);
      DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
                (&this->super_DrawIndirectBase,0,0,uVar12,uVar13 >> 1,pvVar8);
      uVar12 = this->_sizeY >> 1;
      lVar11 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                         ((DrawIndirectBase *)this,
                          (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_1a8,this->_sizeX,uVar12,
                          (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_178,this->_sizeX,uVar12);
      DIResult::sub_result(&local_d68,(DIResult *)local_348,lVar11);
      DILogger::~DILogger(&local_d68);
    }
    this_local = (CPrimitiveMode *)DIResult::code((DIResult *)local_348);
    DIResult::~DIResult((DIResult *)local_348);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_1a8);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_178);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_148);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_120);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_c8);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &padding.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return (long)this_local;
}

Assistant:

long Run(bool pointMode = false)
	{

		glClear(GL_COLOR_BUFFER_BIT);

		_program = CreateProgram(pointMode ? shaders::vshSimple_point<api>() : shaders::vshSimple<api>(), "",
								 shaders::fshSimple<api>(), true);
		if (!_program)
		{
			return ERROR;
		}
		glUseProgram(_program);

		CColorArray coords;
		PrimitiveGen(_primitiveType, _drawSizeX, _drawSizeY, coords);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_ARRAY_BUFFER, _buffer);

		CColorArray padding(10, tcu::Vec4(0.0f));

		glBufferData(GL_ARRAY_BUFFER,
					 (GLsizeiptr)(coords.size() * (sizeof(coords[0])) + padding.size() * (sizeof(padding[0]))), NULL,
					 GL_STREAM_DRAW);
		glBufferSubData(GL_ARRAY_BUFFER, 0, (GLsizeiptr)(padding.size() * (sizeof(padding[0]))), &padding[0]);
		glBufferSubData(GL_ARRAY_BUFFER, (GLintptr)(padding.size() * (sizeof(padding[0]))),
						(GLsizeiptr)(coords.size() * (sizeof(coords[0]))), &coords[0]);

		glVertexAttribPointer(0, sizeof(coords[0]) / sizeof(float), GL_FLOAT, GL_FALSE, sizeof(coords[0]), 0);
		glEnableVertexAttribArray(0);

		DrawElementsIndirectCommand indirectElements = { 0, 0, 0, 0, 0 };
		DrawArraysIndirectCommand   indirectArrays   = { 0, 0, 0, 0 };

		CElementArray elements(coords.size(), 0);
		for (size_t i = 0; i < elements.size(); ++i)
		{
			elements[i] = static_cast<GLuint>(i);
		}

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);

		switch (_drawFunc)
		{
		case DRAW_ARRAYS:
		{
			indirectArrays.count			  = static_cast<GLuint>(coords.size()) / 2;
			indirectArrays.primCount		  = 1;
			indirectArrays.first			  = 10;
			indirectArrays.reservedMustBeZero = 0;

			glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawArraysIndirectCommand), NULL, GL_STATIC_DRAW);
			glBufferSubData(GL_DRAW_INDIRECT_BUFFER, 0, sizeof(DrawArraysIndirectCommand), &indirectArrays);

			glDrawArraysIndirect(_primitiveType, 0);
		}
		break;
		case DRAW_ELEMENTS:
		{
			indirectElements.count				= static_cast<GLuint>(coords.size()) / 2;
			indirectElements.primCount			= 1;
			indirectElements.baseVertex			= 7;
			indirectElements.firstIndex			= 3;
			indirectElements.reservedMustBeZero = 0;

			glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawElementsIndirectCommand), NULL, GL_STATIC_DRAW);
			glBufferSubData(GL_DRAW_INDIRECT_BUFFER, 0, sizeof(DrawElementsIndirectCommand), &indirectElements);

			glGenBuffers(1, &_ebo);
			glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, _ebo);
			glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)(elements.size() * sizeof(elements[0])), &elements[0],
						 GL_STATIC_DRAW);

			glDrawElementsIndirect(_primitiveType, GL_UNSIGNED_INT, 0);
		}
		break;
		default:
			throw std::runtime_error("Unknown draw function!");
			break;
		}

		CColorArray bufferRef1(_sizeX * _sizeY / 2, tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f));
		CColorArray bufferRef2(_sizeX * _sizeY / 2, tcu::Vec4(0.1f, 0.2f, 0.3f, 1.0f));
		CColorArray bufferTest(_sizeX * _sizeY, tcu::Vec4(0.0f));

		DIResult result;
		ReadPixelsFloat<api>(0, (_sizeY + 1) / 2, _sizeX, _sizeY / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, _sizeX, _sizeY / 2, bufferRef1, _sizeX, _sizeY / 2));

		switch (_primitiveType)
		{
		case GL_TRIANGLES_ADJACENCY:
		case GL_TRIANGLE_STRIP_ADJACENCY:
		{
			CColorArray bufferRef3(_sizeX * _sizeY / 16, tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f));
			CColorArray bufferRef4(_sizeX * _sizeY / 8, tcu::Vec4(0.1f, 0.2f, 0.3f, 1.0f));
			CColorArray bufferRef5(_sizeX * _sizeY / 4, tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f));

			CColorArray bufferTest3(_sizeX * _sizeY / 16, tcu::Vec4(0.0f));
			CColorArray bufferTest4(_sizeX * _sizeY / 8, tcu::Vec4(0.0f));
			CColorArray bufferTest5(_sizeX * _sizeY / 4, tcu::Vec4(0.0f));

			ReadPixelsFloat<api>(0, (_sizeY + 3) / 4, _sizeX / 4, _sizeY / 4, &bufferTest3[0]);
			result.sub_result(BuffersCompare(bufferTest3, _sizeX / 4, _sizeY / 4, bufferRef3, _sizeX / 4, _sizeY / 4));

			ReadPixelsFloat<api>((_sizeX + 3) / 4, (_sizeY + 3) / 4, _sizeX / 2, _sizeY / 4, &bufferTest4[0]);
			result.sub_result(BuffersCompare(bufferTest4, _sizeX / 2, _sizeY / 4, bufferRef4, _sizeX / 2, _sizeY / 4));

			ReadPixelsFloat<api>((_sizeX * 3 + 3) / 4, (_sizeY + 3) / 4, _sizeX / 4, _sizeY / 4, &bufferTest3[0]);
			result.sub_result(BuffersCompare(bufferTest3, _sizeX / 4, _sizeY / 4, bufferRef3, _sizeX / 4, _sizeY / 4));

			ReadPixelsFloat<api>(0, 0, _sizeX, _sizeY / 4, &bufferTest5[0]);
			result.sub_result(BuffersCompare(bufferTest5, _sizeX, _sizeY / 4, bufferRef5, _sizeX, _sizeY / 4));
		}
		break;
		default:
		{
			ReadPixelsFloat<api>(0, 0, _sizeX, _sizeY / 2, &bufferTest[0]);
			result.sub_result(BuffersCompare(bufferTest, _sizeX, _sizeY / 2, bufferRef2, _sizeX, _sizeY / 2));
		}
		break;
		}

		return result.code();
	}